

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O2

void mpiabi_rsend_(void *buf,MPIABI_Fint *count,MPIABI_Fint *datatype,MPIABI_Fint *dest,
                  MPIABI_Fint *tag,MPIABI_Fint *comm,MPIABI_Fint *ierror)

{
  mpi_rsend_();
  return;
}

Assistant:

void mpiabi_rsend_(
  const void * buf,
  const MPIABI_Fint * count,
  const MPIABI_Fint * datatype,
  const MPIABI_Fint * dest,
  const MPIABI_Fint * tag,
  const MPIABI_Fint * comm,
  MPIABI_Fint * ierror
) {
  return mpi_rsend_(
    buf,
    count,
    datatype,
    dest,
    tag,
    comm,
    ierror
  );
}